

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suite.c
# Opt level: O0

void destroy_test_suite(TestSuite *suiteToDestroy)

{
  undefined8 *puVar1;
  void *in_RDI;
  TestSuite *suite;
  UnitTest test;
  int i;
  int local_28;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  
  for (iVar2 = 0; iVar2 < *(int *)((long)in_RDI + 0x30); iVar2 = iVar2 + 1) {
    puVar1 = (undefined8 *)(*(long *)((long)in_RDI + 0x18) + (long)iVar2 * 0x18);
    local_28 = (int)*puVar1;
    if ((local_28 == 1) && (puVar1[2] != 0)) {
      *(undefined8 *)(*(long *)((long)in_RDI + 0x18) + (long)iVar2 * 0x18 + 0x10) = 0;
      destroy_test_suite((TestSuite *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
    }
  }
  if (*(long *)((long)in_RDI + 0x18) != 0) {
    free(*(void **)((long)in_RDI + 0x18));
  }
  free(in_RDI);
  return;
}

Assistant:

void destroy_test_suite(TestSuite *suiteToDestroy) {
    int i;
    for (i = 0; i < suiteToDestroy->size; i++) {
        UnitTest test = suiteToDestroy->tests[i];
        TestSuite* suite = test.Runnable.suite;
        if (test_suite == test.type && suite != NULL) {
           suiteToDestroy->tests[i].Runnable.suite = NULL;
           destroy_test_suite(suite);
        }
    }

    if (suiteToDestroy->tests != NULL)
        free(suiteToDestroy->tests);

    free(suiteToDestroy);
}